

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_MapDirectory_Test::TestBody
          (DiskSourceTreeTest_MapDirectory_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  char *contents;
  string_view virtual_path;
  string_view disk_path;
  string local_98;
  undefined1 local_68 [48];
  _func_int **local_38;
  SourceTree local_28;
  
  pbVar3 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98._M_string_length = (size_type)(pbVar3->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)pbVar3->_M_string_length;
  local_68._0_8_ = &DAT_00000004;
  local_68._8_8_ = "/foo";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)&stack0xffffffffffffffc8,(lts_20250127 *)&local_98,(AlphaNum *)local_68,
             (AlphaNum *)local_98._M_string_length);
  DiskSourceTreeTest::AddFile
            ((DiskSourceTreeTest *)&stack0xffffffffffffffc8,(string *)"Hello World!",contents);
  if ((SourceTree *)local_38 != &stack0xffffffffffffffd8) {
    operator_delete(local_38,(long)local_28._vptr_SourceTree + 1);
  }
  pbVar3 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  virtual_path._M_str = "baz";
  virtual_path._M_len = 3;
  disk_path._M_str = (pbVar3->_M_dataplus)._M_p;
  disk_path._M_len = pbVar3->_M_string_length;
  DiskSourceTree::MapPath(&(this->super_DiskSourceTreeTest).source_tree_,virtual_path,disk_path);
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz/foo","");
  DiskSourceTreeTest::ExpectFileContents(&this->super_DiskSourceTreeTest,&local_98,"Hello World!");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz/bar","");
  pcVar2 = local_68 + 0x10;
  local_68._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"File not found.","");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar2) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"foo","");
  local_68._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"File not found.","");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar2) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"bar","");
  local_68._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"File not found.","");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar2) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz//foo","");
  local_68._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,"");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar2) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz/../baz/foo","");
  local_68._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,"");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar2) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz/./foo","");
  local_68._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,"");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar2) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz/foo/","");
  local_68._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"File not found.","");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar2) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F(DiskSourceTreeTest, MapDirectory) {
  // Test opening a file in a directory that is mapped to somewhere other
  // than the root of the source tree.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  source_tree_.MapPath("baz", dirnames_[0]);

  ExpectFileContents("baz/foo", "Hello World!");
  ExpectCannotOpenFile("baz/bar", "File not found.");
  ExpectCannotOpenFile("foo", "File not found.");
  ExpectCannotOpenFile("bar", "File not found.");

  // Non-canonical file names should not work.
  ExpectCannotOpenFile("baz//foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/../baz/foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/./foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/foo/", "File not found.");
}